

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_mp3_init_file(ma_dr_mp3 *pMP3,char *pFilePath,
                             ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  ma_bool32 mVar2;
  FILE *pFile;
  
  mVar1 = ma_fopen(&pFile,pFilePath,"rb");
  mVar2 = 0;
  if (mVar1 == MA_SUCCESS) {
    mVar2 = ma_dr_mp3_init(pMP3,ma_dr_mp3__on_read_stdio,ma_dr_mp3__on_seek_stdio,pFile,
                           pAllocationCallbacks);
    if (mVar2 == 0) {
      fclose((FILE *)pFile);
      mVar2 = 0;
    }
    else {
      mVar2 = 1;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_init_file(ma_dr_mp3* pMP3, const char* pFilePath, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_bool32 result;
    FILE* pFile;
    if (ma_fopen(&pFile, pFilePath, "rb") != MA_SUCCESS) {
        return MA_FALSE;
    }
    result = ma_dr_mp3_init(pMP3, ma_dr_mp3__on_read_stdio, ma_dr_mp3__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    return MA_TRUE;
}